

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O2

ncnn_datareader_t ncnn_datareader_create_from_memory(uchar **mem)

{
  ncnn_datareader_t _dr;
  DataReaderFromMemory_c_api *this;
  
  _dr = (ncnn_datareader_t)malloc(0x18);
  this = (DataReaderFromMemory_c_api *)operator_new(0x18);
  DataReaderFromMemory_c_api::DataReaderFromMemory_c_api(this,mem,_dr);
  _dr->pthis = this;
  _dr->scan = __ncnn_DataReaderFromMemory_scan;
  _dr->read = __ncnn_DataReaderFromMemory_read;
  return _dr;
}

Assistant:

ncnn_datareader_t ncnn_datareader_create_from_memory(const unsigned char** mem)
{
    ncnn_datareader_t dr = (ncnn_datareader_t)malloc(sizeof(struct __ncnn_datareader_t));
    dr->pthis = (void*)(new DataReaderFromMemory_c_api(*mem, dr));
#if NCNN_STRING
    dr->scan = __ncnn_DataReaderFromMemory_scan;
#endif /* NCNN_STRING */
    dr->read = __ncnn_DataReaderFromMemory_read;
    return dr;
}